

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trajectory.hpp
# Opt level: O2

void __thiscall
ruckig::Trajectory<3UL,_ruckig::StandardVector>::at_time
          (Trajectory<3UL,_ruckig::StandardVector> *this,double time,Vector<double> *new_position,
          Vector<double> *new_velocity,Vector<double> *new_acceleration,Vector<double> *new_jerk,
          size_t *new_section)

{
  anon_class_32_4_098e0619 local_20;
  
  local_20.new_position = new_position;
  local_20.new_velocity = new_velocity;
  local_20.new_acceleration = new_acceleration;
  local_20.new_jerk = new_jerk;
  Trajectory<3ul,ruckig::StandardVector>::
  state_to_integrate_from<ruckig::Trajectory<3ul,ruckig::StandardVector>::at_time(double,std::array<double,3ul>&,std::array<double,3ul>&,std::array<double,3ul>&,std::array<double,3ul>&,unsigned_long&)const::_lambda(unsigned_long,double,double,double,double,double)_1_>
            ((Trajectory<3ul,ruckig::StandardVector> *)this,time,new_section,&local_20);
  return;
}

Assistant:

void at_time(double time, Vector<double>& new_position, Vector<double>& new_velocity, Vector<double>& new_acceleration, Vector<double>& new_jerk, size_t& new_section) const {
        if constexpr (DOFs == 0) {
            if (degrees_of_freedom != new_position.size() || degrees_of_freedom != new_velocity.size() || degrees_of_freedom != new_acceleration.size() || degrees_of_freedom != new_jerk.size()) {
                throw RuckigError("mismatch in degrees of freedom (vector size).");
            }
        }

        state_to_integrate_from(time, new_section, [&](size_t dof, double t, double p, double v, double a, double j) {
            std::tie(new_position[dof], new_velocity[dof], new_acceleration[dof]) = integrate(t, p, v, a, j);
            new_jerk[dof] = j;
        });
    }